

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  int in_EDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair *v;
  ImGuiStoragePair *in_stack_ffffffffffffffd8;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffe0;
  ImGuiStoragePair *local_18;
  
  local_18 = LowerBound(in_RDI,in_ESI);
  v = local_18;
  pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((v == pIVar1) || (local_18->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair((ImGuiStoragePair *)&stack0xffffffffffffffd8,in_ESI,in_EDX);
    local_18 = ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                         ((ImVector<ImGuiStorage::ImGuiStoragePair> *)
                          in_stack_ffffffffffffffe0.val_p,in_stack_ffffffffffffffd8,v);
  }
  return (int *)&local_18->field_1;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_i;
}